

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tfad.h
# Opt level: O2

value_type __thiscall
TFadFuncSqrt<TFadExpr<TFadBinaryMinus<TFad<6,_double>,_TFad<6,_double>_>_>_>::dx
          (TFadFuncSqrt<TFadExpr<TFadBinaryMinus<TFad<6,_double>,_TFad<6,_double>_>_>_> *this,int i)

{
  double dVar1;
  double dVar2;
  TFad<6,_double> *pTVar3;
  TFad<6,_double> *pTVar4;
  double dVar5;
  
  pTVar3 = (this->expr_).fadexpr_.left_;
  pTVar4 = (this->expr_).fadexpr_.right_;
  dVar1 = pTVar3->dx_[i];
  dVar2 = pTVar4->dx_[i];
  dVar5 = pTVar3->val_ - pTVar4->val_;
  if (dVar5 < 0.0) {
    dVar5 = sqrt(dVar5);
  }
  else {
    dVar5 = SQRT(dVar5);
  }
  return (dVar1 - dVar2) / (dVar5 + dVar5);
}

Assistant:

const T dx(int i) const { return dx_[i];}